

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::CheckEvalRestriction(ScriptContext *this)

{
  HostScriptContext *pHVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint hr;
  undefined4 *puVar6;
  void *__frameAddr;
  undefined1 local_60 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  Var domError;
  
  __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
  __leaveScriptObject._36_4_ = 0;
  pHVar1 = this->hostScriptContext;
  LeaveScriptObject<true,_true,_false>::LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)local_60,this,&stack0xfffffffffffffff8);
  pTVar2 = this->threadContext;
  bVar4 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  uVar5 = (*pHVar1->_vptr_HostScriptContext[0xd])(pHVar1);
  hr = uVar5;
  if ((int)uVar5 < 0) {
    hr = (*pHVar1->_vptr_HostScriptContext[0xe])
                   (pHVar1,(ulong)uVar5,&__leaveScriptObject.__exceptionCheck);
    ThreadContext::DisposeOnLeaveScript(this->threadContext);
  }
  pTVar2->reentrancySafeOrHandled = bVar4;
  LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)local_60);
  if (-1 < (int)uVar5) {
    return;
  }
  if ((int)hr < 0) {
    JavascriptError::MapAndThrowError(this,hr);
  }
  if (__leaveScriptObject._32_8_ != 0) {
    JavascriptExceptionOperators::Throw((Var)__leaveScriptObject._32_8_,this);
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                              ,0x78a,"(false)","We should have thrown by now.");
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar6 = 0;
  JavascriptError::MapAndThrowError(this,-0x7fffbffb);
}

Assistant:

void ScriptContext::CheckEvalRestriction()
    {
        HRESULT hr = S_OK;
        Var domError = nullptr;
        HostScriptContext* hostScriptContext = this->GetHostScriptContext();

        BEGIN_LEAVE_SCRIPT(this)
        {
            if (!FAILED(hr = hostScriptContext->CheckEvalRestriction()))
            {
                return;
            }

            hr = hostScriptContext->HostExceptionFromHRESULT(hr, &domError);
        }
        END_LEAVE_SCRIPT(this);

        if (FAILED(hr))
        {
            Js::JavascriptError::MapAndThrowError(this, hr);
        }

        if (domError != nullptr)
        {
            JavascriptExceptionOperators::Throw(domError, this);
        }

        AssertMsg(false, "We should have thrown by now.");
        Js::JavascriptError::MapAndThrowError(this, E_FAIL);
    }